

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O0

void __thiscall Storage::Disk::MacintoshIMG::MacintoshIMG(MacintoshIMG *this,string *file_name)

{
  byte bVar1;
  uint8_t uVar2;
  undefined4 *puVar3;
  size_type sVar4;
  uint *__nbytes;
  uint32_t computed_tag_checksum;
  uint32_t computed_data_checksum;
  undefined1 local_58 [32];
  uint16_t magic_number;
  uint8_t encoding;
  uint32_t tag_checksum;
  uint32_t data_checksum;
  uint32_t tag_block_length;
  uint32_t data_block_length;
  uint32_t magic_word;
  uint8_t name_length;
  string *local_18;
  string *file_name_local;
  MacintoshIMG *this_local;
  
  local_18 = file_name;
  file_name_local = (string *)this;
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MacintoshIMG_00caa580;
  FileHolder::FileHolder(&this->file_,local_18,ReadWrite);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->tags_);
  this->is_diskCopy_file_ = false;
  std::mutex::mutex(&this->buffer_mutex_);
  this->raw_offset_ = 0;
  data_block_length._3_1_ = FileHolder::get8(&this->file_);
  if ((data_block_length._3_1_ == 0x4c) || (data_block_length._3_1_ == 0)) {
    bVar1 = FileHolder::get8(&this->file_);
    tag_block_length = (uint32_t)bVar1;
    if (((data_block_length._3_1_ != 0x4c) || (tag_block_length != 0x4b)) &&
       ((data_block_length._3_1_ != 0 || (tag_block_length != 0)))) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    construct_raw_gcr(this,0,0);
  }
  else {
    this->is_diskCopy_file_ = true;
    if (0x40 < data_block_length._3_1_) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    FileHolder::seek(&this->file_,0x40,0);
    data_checksum = FileHolder::get32be(&this->file_);
    tag_checksum = FileHolder::get32be(&this->file_);
    _magic_number = FileHolder::get32be(&this->file_);
    local_58._28_4_ = FileHolder::get32be(&this->file_);
    if (data_checksum == 0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    local_58[0x1b] = FileHolder::get8(&this->file_);
    __nbytes = &switchD_00972e91::switchdataD_00a71000;
    switch(local_58[0x1b]) {
    case 0:
      this->encoding_ = GCR400;
      break;
    case 1:
      this->encoding_ = GCR800;
      break;
    case 2:
      this->encoding_ = MFM720;
      break;
    case 3:
      this->encoding_ = MFM1440;
      break;
    default:
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    uVar2 = FileHolder::get8(&this->file_);
    this->format_ = uVar2;
    local_58._24_2_ = FileHolder::get16be(&this->file_);
    if (local_58._24_2_ != 0x100) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    FileHolder::read((FileHolder *)local_58,(int)this + 8,(void *)(ulong)data_checksum,
                     (size_t)__nbytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    FileHolder::read((FileHolder *)&computed_tag_checksum,(int)this + 8,(void *)(ulong)tag_checksum,
                     (size_t)__nbytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->tags_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&computed_tag_checksum);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&computed_tag_checksum);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    if ((sVar4 != data_checksum) ||
       (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->tags_),
       sVar4 != tag_checksum)) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    checksum(this,&this->data_,0);
    checksum(this,&this->tags_,0xc);
  }
  return;
}

Assistant:

MacintoshIMG::MacintoshIMG(const std::string &file_name) :
	file_(file_name) {

	// Test 1: is this a raw sector dump? If so it'll start with
	// either the magic word 0x4C4B (big endian) or with 0x0000
	// and be exactly 819,200 bytes long if double sided, or
	// 409,600 bytes if single sided.
	//
	// Luckily, both 0x00 and 0x4c are invalid string length for the proper
	// DiskCopy 4.2 format, so there's no ambiguity here.
	const auto name_length = file_.get8();
	if(name_length == 0x4c || !name_length) {
		uint32_t magic_word = file_.get8();
		if(!((name_length == 0x4c && magic_word == 0x4b) || (name_length == 0x00 && magic_word == 0x00)))
			throw Error::InvalidFormat;

		construct_raw_gcr(0);
	} else {
		// DiskCopy 4.2 it is then:
		//
		// File format starts with 64 bytes dedicated to the disk name;
		// this is a Pascal-style string though there is apparently a
		// bug in one version of Disk Copy that can cause the length to
		// be one too high.
		//
		// Validate the length, then skip the rest of the string.
		is_diskCopy_file_ = true;
		if(name_length > 64)
			throw Error::InvalidFormat;

		// Get the length of the data and tag blocks.
		file_.seek(64, SEEK_SET);
		const auto data_block_length = file_.get32be();
		const auto tag_block_length = file_.get32be();
		const auto data_checksum = file_.get32be();
		const auto tag_checksum = file_.get32be();

		// Don't continue with no data.
		if(!data_block_length)
			throw Error::InvalidFormat;

		// Check that this is a comprehensible disk encoding.
		const auto encoding = file_.get8();
		switch(encoding) {
			default: throw Error::InvalidFormat;

			case 0:	encoding_ = Encoding::GCR400;	break;
			case 1:	encoding_ = Encoding::GCR800;	break;
			case 2:	encoding_ = Encoding::MFM720;	break;
			case 3:	encoding_ = Encoding::MFM1440;	break;
		}
		format_ = file_.get8();

		// Check the magic number.
		const auto magic_number = file_.get16be();
		if(magic_number != 0x0100)
			throw Error::InvalidFormat;

		// Read the data and tags, and verify that enough data
		// was present.
		data_ = file_.read(data_block_length);
		tags_ = file_.read(tag_block_length);

		if(data_.size() != data_block_length || tags_.size() != tag_block_length)
			throw Error::InvalidFormat;

		// Verify the two checksums.
		const auto computed_data_checksum = checksum(data_);
		const auto computed_tag_checksum = checksum(tags_, 12);

		/*
			Yuck! It turns out that at least some disk images have incorrect checksums,
			and other emulators accept them regardless. So this test is disabled, at least
			for now. It'd probably be smarter to accept the disk image as provisionally
			incorrect and somehow communicate the issue to the user? Or, much better,
			verify the filesystem if the checksums don't match.
		*/
		(void)data_checksum;
		(void)computed_data_checksum;
		(void)tag_checksum;
		(void)computed_tag_checksum;

//		if(computed_tag_checksum != tag_checksum || computed_data_checksum != data_checksum)
//			throw Error::InvalidFormat;
	}
}